

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_4fPoint * __thiscall ON_4fPoint::operator=(ON_4fPoint *this,double *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (p == (double *)0x0) {
    fVar1 = 0.0;
    fVar2 = 0.0;
    fVar3 = 0.0;
    fVar4 = 1.0;
  }
  else {
    fVar3 = (float)p[2];
    fVar4 = (float)p[3];
    fVar1 = (float)*p;
    fVar2 = (float)p[1];
  }
  this->x = fVar1;
  this->y = fVar2;
  this->z = fVar3;
  this->w = fVar4;
  return this;
}

Assistant:

ON_4fPoint& ON_4fPoint::operator=(const double* p)
{
  if ( p ) {
    x = (float)p[0];
    y = (float)p[1];
    z = (float)p[2];
    w = (float)p[3];
  }
  else {
    x = y = z = 0.0; w = 1.0;
  }
  return *this;
}